

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
DoMarkArgsAsVars<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::EquivalenceId>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::EquivalenceId>
                 *con,int param_3)

{
  undefined4 in_EDX;
  CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::EquivalenceId>
  *in_RSI;
  function<void_(int)> *in_stack_ffffffffffffffb8;
  function<void_(int)> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::function<void_(int)>::function(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  VisitArguments<mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::EquivalenceId>>
            (in_RSI,(function<void_(int)> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::function<void_(int)>::~function((function<void_(int)> *)0x4e07a9);
  return;
}

Assistant:

void DoMarkArgsAsVars(const Con& con, int ) {
    VisitArguments(con, MarkVar_);
  }